

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgatexture.cpp
# Opt level: O3

FTexture * TGATexture_TryCreate(FileReader *file,int lumpnum)

{
  FTGATexture *this;
  TGAHeader local_32;
  
  if (0x11 < file->Length) {
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_32,0x12);
    if (1 < local_32.has_cm) {
      return (FTexture *)0x0;
    }
    if ((ushort)(local_32.width - 0x801U) < 0xf800) {
      return (FTexture *)0x0;
    }
    if ((ushort)(local_32.height - 0x801U) < 0xf800) {
      return (FTexture *)0x0;
    }
    if (0x20 < (ulong)local_32.bpp) {
      return (FTexture *)0x0;
    }
    if ((0x101018100U >> ((ulong)local_32.bpp & 0x3f) & 1) == 0) {
      return (FTexture *)0x0;
    }
    if ((4 < (byte)(local_32.img_type - 4) && 0xf4 < (byte)(local_32.img_type - 0xc)) &&
       ((local_32.img_desc & 0x10) == 0)) {
      (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
      (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_32,0x12);
      this = (FTGATexture *)operator_new(0xa8);
      FTGATexture::FTGATexture(this,lumpnum,&local_32);
      return &this->super_FTexture;
    }
  }
  return (FTexture *)0x0;
}

Assistant:

FTexture *TGATexture_TryCreate(FileReader & file, int lumpnum)
{
	TGAHeader hdr;

	if (file.GetLength() < (long)sizeof(hdr)) return NULL;
	
	file.Seek(0, SEEK_SET);
	file.Read(&hdr, sizeof(hdr));
	hdr.width = LittleShort(hdr.width);
	hdr.height = LittleShort(hdr.height);
	
	// Not much that can be done here because TGA does not have a proper
	// header to be identified with.
	if (hdr.has_cm != 0 && hdr.has_cm != 1) return NULL;
	if (hdr.width <=0 || hdr.height <=0 || hdr.width > 2048 || hdr.height > 2048) return NULL;
	if (hdr.bpp != 8 && hdr.bpp != 15 && hdr.bpp != 16 && hdr.bpp !=24 && hdr.bpp !=32) return NULL;
	if (hdr.img_type <= 0 || hdr.img_type > 11) return NULL;
	if (hdr.img_type >=4  && hdr.img_type <= 8) return NULL;
	if ((hdr.img_desc & 16) != 0) return NULL;

	file.Seek(0, SEEK_SET);
	file.Read(&hdr, sizeof(hdr));
	hdr.width = LittleShort(hdr.width);
	hdr.height = LittleShort(hdr.height);

	return new FTGATexture(lumpnum, &hdr);
}